

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

bool kratos::safe_to_resize_
               (Simulator *sim,Var *var,uint32_t target_size,bool is_signed,
               queue<const_kratos::IterVar_*,_std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
               *vars)

{
  iterator *piVar1;
  _Elt_pointer ppIVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  byte bVar6;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar7;
  ulong uVar8;
  optional<long> value;
  optional<long> value_00;
  undefined1 local_60 [8];
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> v;
  IterVar *t;
  
  ppIVar2 = (vars->c).
            super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((vars->c).super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == ppIVar2) {
    iVar4 = (*(var->super_IRNode)._vptr_IRNode[0x28])(var);
    if ((*(uint *)(CONCAT44(extraout_var,iVar4) + 0x168) & 0xfffffffb) != 0) {
      return true;
    }
    uVar5 = (*(var->super_IRNode)._vptr_IRNode[7])(var);
    return uVar5 <= target_size;
  }
  v.super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>.
  _M_payload.
  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
  .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>._24_8_
       = *ppIVar2;
  std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>::pop_front(&vars->c)
  ;
  value.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_ =
       1;
  value.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value =
       ((_Storage<long,_true> *)
       (v.
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _24_8_ + 0x270))->_M_value;
  Simulator::set_i(sim,(Var *)v.
                              super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              ._24_8_,value,false);
  Simulator::eval_expr
            ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_60,sim,
             var);
  uVar7 = extraout_RDX;
  if (v.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload.field2[0x10] == '\x01') {
    uVar7 = *(ulong *)local_60;
  }
  if (v.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload.field2[0x10] == '\0') {
    return false;
  }
  bVar6 = (byte)target_size;
  if (is_signed) {
    uVar8 = -1L << (bVar6 - 1 & 0x3f);
    if ((long)~uVar8 < (long)uVar7 || (long)uVar7 < (long)uVar8) goto LAB_0018e530;
LAB_0018e535:
    bVar3 = true;
  }
  else {
    if ((target_size == 0x40) || (uVar7 >> (bVar6 & 0x3f) == 0)) goto LAB_0018e535;
LAB_0018e530:
    bVar3 = false;
  }
  if ((v.
       super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
       .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
       _M_payload.field2[0x10] != '\0') &&
     (v.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload.field2[0x10] = 0, local_60 != (undefined1  [8])0x0)) {
    operator_delete((void *)local_60,
                    (long)v.
                          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_60);
  }
  if (!bVar3) {
    return false;
  }
  value_00.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value =
       *(long *)(v.
                 super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ._24_8_ + 0x278) + -1;
  value_00.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _8_8_ = 1;
  Simulator::set_i(sim,(Var *)v.
                              super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              ._24_8_,value_00,false);
  Simulator::eval_expr
            ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_60,sim,
             var);
  uVar7 = extraout_RDX_00;
  if (v.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload.field2[0x10] == '\x01') {
    uVar7 = *(ulong *)local_60;
  }
  if (v.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload.field2[0x10] == '\0') {
    return false;
  }
  if (is_signed) {
    uVar8 = -1L << (bVar6 - 1 & 0x3f);
    if ((long)uVar7 <= (long)~uVar8 && (long)uVar8 <= (long)uVar7) {
LAB_0018e5ea:
      bVar3 = true;
      goto LAB_0018e5ed;
    }
  }
  else if ((target_size == 0x40) || (uVar7 >> (bVar6 & 0x3f) == 0)) goto LAB_0018e5ea;
  bVar3 = false;
LAB_0018e5ed:
  if ((v.
       super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
       .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
       _M_payload.field2[0x10] != '\0') &&
     (v.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload.field2[0x10] = 0, local_60 != (undefined1  [8])0x0)) {
    operator_delete((void *)local_60,
                    (long)v.
                          super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ._M_payload._M_value.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_60);
  }
  if (!bVar3) {
    return false;
  }
  bVar3 = safe_to_resize_(sim,var,target_size,is_signed,vars);
  ppIVar2 = (vars->c).
            super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppIVar2 ==
      (vars->c).super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<kratos::IterVar_const*,std::allocator<kratos::IterVar_const*>>::
    _M_push_back_aux<kratos::IterVar_const*const&>
              ((deque<kratos::IterVar_const*,std::allocator<kratos::IterVar_const*>> *)vars,
               (IterVar **)
               &v.
                super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ._M_engaged);
    return bVar3;
  }
  *ppIVar2 = (IterVar *)
             v.
             super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ._24_8_;
  piVar1 = &(vars->c).
            super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
            _M_impl.super__Deque_impl_data._M_finish;
  piVar1->_M_cur = piVar1->_M_cur + 1;
  return bVar3;
}

Assistant:

bool safe_to_resize_(Simulator &sim, const Var *var, uint32_t target_size, bool is_signed,
                     std::queue<const IterVar *> &vars) {
    // notice it's exclusive for max
    if (vars.empty()) {
        const auto *p = var->get_var_root_parent();
        if (p->type() == VarType::Base || p->type() == VarType::PortIO)
            return var->width() <= target_size;
        else
            return true;
    } else {
        // pop one
        auto *t = const_cast<IterVar *>(vars.front());
        vars.pop();
        sim.set_i(t, t->min_value(), false);
        {
            auto v = sim.eval_expr(var);
            auto num = convert_value(var, v);
            if (!num) return false;
            auto result =
                Const::is_legal(*num, target_size, is_signed) == Const::ConstantLegal::Legal;
            if (!result) return false;
        }
        // notice it's exclusive for max
        sim.set_i(t, t->max_value() - 1, false);
        {
            auto v = sim.eval_expr(var);
            auto num = convert_value(var, v);
            if (!num) return false;
            auto result =
                Const::is_legal(*num, target_size, is_signed) == Const::ConstantLegal::Legal;
            if (!result) return false;
        }
        auto r = safe_to_resize_(sim, var, target_size, is_signed, vars);
        // put it back for backtracking
        vars.push(t);
        return r;
    }
}